

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O0

void inc_phase(huc6280_state *info,Sint32 i)

{
  Sint32 lfo;
  Sint32 i_local;
  huc6280_state *info_local;
  
  if ((i == 0) && (info->LfoCtrl != 0)) {
    info->Psg[0].phase =
         info->Psg[0].phase +
         (int)(long)((info->RESMPL_RATE * 134217728.0) /
                     (double)(info->Psg[0].frq +
                             (info->Psg[1].wave[info->Psg[1].phase >> 0x1b] <<
                             ((char)info->LfoCtrl * '\x02' - 2U & 0x1f))) + 0.5);
    info->Psg[1].phase =
         (int)(long)((info->RESMPL_RATE * 134217728.0) / (double)(info->Psg[1].frq * info->LfoFrq) +
                    0.5) + info->Psg[1].phase;
  }
  else {
    info->Psg[i].phase = info->Psg[i].deltaPhase + info->Psg[i].phase;
  }
  return;
}

Assistant:

INLINE void
inc_phase(
	huc6280_state* info,
	Sint32		i)
{
	Sint32		lfo;

	if ((i==0)&&(info->LfoCtrl>0))
	{
		//_LfoCtrlが1のときに0回シフト(そのまま)で、はにいいんざすかいが実機の音に近い。
		//_LfoCtrlが3のときに4回シフトで、フラッシュハイダースが実機の音に近い。
		lfo = info->Psg[1].wave[info->Psg[1].phase >> 27] << ((info->LfoCtrl-1) << 1); //v1.60更新
		info->Psg[0].phase += (Uint32)((double)(65536.0 * 256.0 * 8.0 * info->RESMPL_RATE) / (double)(info->Psg[0].frq + lfo) +0.5);
		info->Psg[1].phase += (Uint32)((double)(65536.0 * 256.0 * 8.0 * info->RESMPL_RATE) / (double)(info->Psg[1].frq * info->LfoFrq) +0.5); //v1.60更新
	}
	else
		info->Psg[i].phase += info->Psg[i].deltaPhase;
}